

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileutils.c
# Opt level: O1

void write_crl(scep *s)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  FILE *pFVar4;
  FILE *pFVar5;
  X509_NAME *pXVar6;
  char *pcVar7;
  char *pcVar8;
  X509_NAME *b;
  FILE *pFVar9;
  BIO *bp;
  PKCS7 *pPVar10;
  X509 *pXVar11;
  X509_EXTENSION *pXVar12;
  ulong uVar13;
  ulong uVar14;
  undefined8 uVar15;
  FILE *unaff_RBX;
  X509 *unaff_RBP;
  long lVar16;
  int *piVar17;
  X509 *unaff_R13;
  char **unaff_R14;
  ulong uVar18;
  char **unaff_R15;
  char **ppcVar19;
  uint uStack_1d2c;
  PKCS7 *pPStack_1d28;
  BIO *pBStack_1d20;
  long lStack_1d18;
  byte abStack_1d10 [64];
  char acStack_1cd0 [1024];
  char acStack_18d0 [1032];
  X509 *pXStack_14c8;
  int *piStack_14c0;
  X509 *pXStack_14b8;
  FILE *pFStack_14b0;
  FILE *pFStack_14a8;
  X509 *pXStack_14a0;
  FILE *pFStack_1490;
  FILE aFStack_1488 [4];
  FILE *pFStack_1080;
  int *piStack_1078;
  X509 *pXStack_1070;
  FILE *pFStack_1068;
  FILE *pFStack_1060;
  X509 *pXStack_1058;
  X509 aXStack_1050 [5];
  X509 aXStack_c50 [5];
  char acStack_850 [2056];
  FILE *pFStack_48;
  
  pFVar9 = (FILE *)((s->reply_p7->d).sign)->crl;
  pFVar4 = (FILE *)OPENSSL_sk_value(pFVar9,0);
  if (pFVar4 == (FILE *)0x0) {
    write_crl_cold_3();
LAB_0010da68:
    write_crl_cold_2();
  }
  else {
    unaff_R15 = &w_char;
    pFVar9 = (FILE *)w_char;
    pFVar5 = fopen(w_char,"w");
    unaff_R14 = (char **)pFVar4;
    if (pFVar5 == (FILE *)0x0) goto LAB_0010da68;
    if (v_flag != 0) {
      printf("%s: writing CRL\n",pname);
    }
    if (d_flag != 0) {
      PEM_write_X509_CRL(_stdout,(X509_CRL *)pFVar4);
    }
    pFVar9 = pFVar5;
    iVar2 = PEM_write_X509_CRL(pFVar5,(X509_CRL *)pFVar4);
    unaff_RBX = pFVar5;
    if (iVar2 == 1) {
      printf("%s: CRL written as %s\n",pname,w_char);
      fclose(pFVar5);
      return;
    }
  }
  write_crl_cold_1();
  localcert = (X509 *)0x0;
  pFVar9 = *(FILE **)(*(long *)(pFVar9->__pad5 + 0x20) + 0x10);
  piVar17 = &v_flag;
  pFStack_48 = unaff_RBX;
  if (v_flag != 0) {
    pXStack_1058 = (X509 *)0x10dab3;
    uVar3 = OPENSSL_sk_num(pFVar9);
    pXStack_1058 = (X509 *)0x10dac3;
    printf("write_local_cert(): found %d cert(s)\n",(ulong)uVar3);
  }
  pXStack_1058 = (X509 *)0x10dacb;
  pFVar4 = pFVar9;
  iVar2 = OPENSSL_sk_num();
  pXVar11 = (X509 *)localcert;
  if (0 < iVar2) {
    unaff_R14 = (char **)0x0;
    do {
      pXStack_1058 = (X509 *)0x10dae1;
      unaff_R13 = (X509 *)OPENSSL_sk_value(pFVar9,unaff_R14);
      pcVar8 = pname;
      if (v_flag != 0) {
        pXStack_1058 = (X509 *)0x10db01;
        pXVar6 = X509_get_subject_name(unaff_R13);
        pXStack_1058 = (X509 *)0x10db14;
        pcVar7 = X509_NAME_oneline(pXVar6,(char *)aXStack_1050,0x400);
        pXStack_1058 = (X509 *)0x10db28;
        printf("%s: found certificate with\n  subject: \'%s\'\n",pcVar8,pcVar7);
        pXStack_1058 = (X509 *)0x10db30;
        pXVar6 = X509_get_issuer_name(unaff_R13);
        pXStack_1058 = (X509 *)0x10db40;
        pcVar8 = X509_NAME_oneline(pXVar6,(char *)aXStack_1050,0x400);
        pXStack_1058 = (X509 *)0x10db51;
        printf("  issuer: %s\n",pcVar8);
        pXStack_1058 = (X509 *)0x10db5d;
        pXVar6 = (X509_NAME *)X509_REQ_get_subject_name(request);
        pXStack_1058 = (X509 *)0x10db6d;
        pcVar8 = X509_NAME_oneline(pXVar6,(char *)aXStack_1050,0x400);
        pXStack_1058 = (X509 *)0x10db7e;
        printf("  request_subject: \'%s\'\n",pcVar8);
        unaff_RBP = aXStack_1050;
      }
      pXStack_1058 = (X509 *)0x10db86;
      pXVar6 = X509_get_subject_name(unaff_R13);
      pXStack_1058 = (X509 *)0x10db95;
      b = (X509_NAME *)X509_REQ_get_subject_name(request);
      pXStack_1058 = (X509 *)0x10dba0;
      iVar2 = X509_NAME_cmp(pXVar6,b);
      if (d_flag != 0) {
        pXStack_1058 = (X509 *)0x10dc81;
        write_local_cert_cold_1();
      }
      if (iVar2 == 0) {
LAB_0010dc26:
        if (v_flag != 0) {
          pXStack_1058 = (X509 *)0x10dc39;
          puts("CN\'s of request and certificate matched!");
        }
      }
      else {
        pXStack_1058 = (X509 *)0x10dbc0;
        pXVar6 = X509_get_subject_name(unaff_R13);
        pXStack_1058 = (X509 *)0x10dbd8;
        X509_NAME_oneline(pXVar6,acStack_850,0x400);
        pXStack_1058 = (X509 *)0x10dbe4;
        pXVar6 = (X509_NAME *)X509_REQ_get_subject_name(request);
        unaff_RBP = aXStack_c50;
        pXStack_1058 = (X509 *)0x10dbfc;
        X509_NAME_oneline(pXVar6,(char *)unaff_RBP,0x400);
        if (v_flag != 0) {
          pXStack_1058 = (X509 *)0x10dc17;
          printf(" X509_NAME_cmp() workaround: strcmp request subject (%s) to cert subject (%s)\n",
                 unaff_RBP,acStack_850);
        }
        pXStack_1058 = (X509 *)0x10dc22;
        iVar2 = strcmp(acStack_850,(char *)unaff_RBP);
        if (iVar2 == 0) goto LAB_0010dc26;
        pXStack_1058 = (X509 *)0x10dc8b;
        write_local_cert_cold_2();
      }
      pXStack_1058 = (X509 *)0x10dc41;
      unaff_R15 = (char **)X509_get_subject_name(unaff_R13);
      pXStack_1058 = (X509 *)0x10dc4c;
      pXVar6 = X509_get_issuer_name(unaff_R13);
      pXStack_1058 = (X509 *)0x10dc57;
      pFVar4 = (FILE *)unaff_R15;
      iVar2 = X509_NAME_cmp((X509_NAME *)unaff_R15,pXVar6);
      pXVar11 = unaff_R13;
      if (iVar2 != 0) break;
      uVar3 = (int)unaff_R14 + 1;
      unaff_R14 = (char **)(ulong)uVar3;
      pXStack_1058 = (X509 *)0x10dc66;
      pFVar4 = pFVar9;
      iVar2 = OPENSSL_sk_num();
      pXVar11 = (X509 *)localcert;
    } while ((int)uVar3 < iVar2);
  }
  localcert = (X509 *)pXVar11;
  if (localcert == (X509 *)0x0) {
    pXStack_1058 = (X509 *)0x10dd37;
    write_local_cert_cold_5();
LAB_0010dd37:
    pXStack_1058 = (X509 *)0x10dd3c;
    write_local_cert_cold_4();
  }
  else {
    unaff_R14 = &l_char;
    pXStack_1058 = (X509 *)0x10dcb8;
    pFVar4 = (FILE *)l_char;
    pFVar5 = fopen(l_char,"w");
    if (pFVar5 == (FILE *)0x0) goto LAB_0010dd37;
    if (v_flag != 0) {
      pXStack_1058 = (X509 *)0x10dce2;
      printf("%s: certificate written as %s\n",pname,l_char);
    }
    if (d_flag != 0) {
      pXStack_1058 = (X509 *)0x10dd04;
      PEM_write_X509(_stdout,(X509 *)localcert);
    }
    pXStack_1058 = (X509 *)0x10dd13;
    pFVar4 = pFVar5;
    iVar2 = PEM_write_X509(pFVar5,(X509 *)localcert);
    pFVar9 = pFVar5;
    if (iVar2 == 1) {
      pXStack_1058 = (X509 *)0x10dd20;
      fclose(pFVar5);
      return;
    }
  }
  pXStack_1058 = (X509 *)write_other_cert;
  write_local_cert_cold_3();
  piStack_1078 = &v_flag;
  ppcVar19 = *(char ***)(*(long *)(pFVar4->__pad5 + 0x20) + 0x10);
  pXStack_14a0 = (X509 *)0x10dd6e;
  pFVar5 = (FILE *)ppcVar19;
  pFStack_1490 = pFVar4;
  pFStack_1080 = pFVar9;
  pXStack_1070 = unaff_R13;
  pFStack_1068 = (FILE *)unaff_R14;
  pFStack_1060 = (FILE *)unaff_R15;
  pXStack_1058 = unaff_RBP;
  iVar2 = OPENSSL_sk_num();
  pXVar11 = (X509 *)0x0;
  if (0 < iVar2) {
    unaff_R13 = (X509 *)0x0;
    do {
      pXStack_14a0 = (X509 *)0x10dd86;
      unaff_RBP = (X509 *)OPENSSL_sk_value(ppcVar19,unaff_R13);
      pcVar8 = pname;
      if (v_flag != 0) {
        pXStack_14a0 = (X509 *)0x10dda7;
        pXVar6 = X509_get_subject_name(unaff_RBP);
        unaff_R14 = (char **)aFStack_1488;
        pXStack_14a0 = (X509 *)0x10ddbc;
        pcVar7 = X509_NAME_oneline(pXVar6,(char *)unaff_R14,0x400);
        pXStack_14a0 = (X509 *)0x10ddd0;
        printf("%s: found certificate with\n  subject: %s\n",pcVar8,pcVar7);
        pXStack_14a0 = (X509 *)0x10ddd8;
        pXVar6 = X509_get_issuer_name(unaff_RBP);
        pXStack_14a0 = (X509 *)0x10dde8;
        pcVar7 = X509_NAME_oneline(pXVar6,(char *)unaff_R14,0x400);
        pXStack_14a0 = (X509 *)0x10ddf9;
        printf("  issuer: %s\n",pcVar7);
        piVar17 = (int *)pcVar8;
      }
      pXStack_14a0 = (X509 *)0x10de01;
      pFVar5 = (FILE *)X509_get_serialNumber(unaff_RBP);
      pXStack_14a0 = (X509 *)0x10de19;
      iVar2 = ASN1_INTEGER_cmp((ASN1_INTEGER *)pFVar5,
                               *(ASN1_INTEGER **)((long)pFStack_1490->__pad3 + 8));
      pXVar11 = unaff_RBP;
      if (iVar2 == 0) break;
      uVar3 = (int)unaff_R13 + 1;
      unaff_R13 = (X509 *)(ulong)uVar3;
      pXStack_14a0 = (X509 *)0x10de2c;
      pFVar5 = (FILE *)ppcVar19;
      iVar2 = OPENSSL_sk_num();
      pXVar11 = (X509 *)0x0;
    } while ((int)uVar3 < iVar2);
  }
  if (pXVar11 == (X509 *)0x0) {
    pXStack_14a0 = (X509 *)0x10ded0;
    write_other_cert_cold_3();
  }
  else {
    ppcVar19 = &w_char;
    pXStack_14a0 = (X509 *)0x10de54;
    pFVar5 = (FILE *)w_char;
    pFVar9 = fopen(w_char,"w");
    if (pFVar9 != (FILE *)0x0) {
      if (v_flag != 0) {
        pXStack_14a0 = (X509 *)0x10de83;
        printf("%s: certificate written as %s\n",pname,w_char);
      }
      if (d_flag != 0) {
        pXStack_14a0 = (X509 *)0x10dea1;
        PEM_write_X509(_stdout,pXVar11);
      }
      pXStack_14a0 = (X509 *)0x10deac;
      pFVar5 = pFVar9;
      iVar2 = PEM_write_X509(pFVar9,pXVar11);
      unaff_R14 = (char **)pFVar9;
      if (iVar2 == 1) {
        pXStack_14a0 = (X509 *)0x10deb9;
        fclose(pFVar9);
        return;
      }
      goto LAB_0010ded5;
    }
  }
  pXStack_14a0 = (X509 *)0x10ded5;
  write_other_cert_cold_2();
LAB_0010ded5:
  pXStack_14a0 = (X509 *)write_ca_ra;
  write_other_cert_cold_1();
  pXStack_14c8 = pXVar11;
  piStack_14c0 = piVar17;
  pXStack_14b8 = unaff_R13;
  pFStack_14b0 = (FILE *)unaff_R14;
  pFStack_14a8 = (FILE *)ppcVar19;
  pXStack_14a0 = unaff_RBP;
  bp = BIO_new_mem_buf(pFVar5->_IO_read_end,*(int *)&pFVar5->_IO_read_base);
  pPVar10 = d2i_PKCS7_bio(bp,(PKCS7 **)0x0);
  if (pPVar10 == (PKCS7 *)0x0) {
    pcVar8 = "%s: error reading PKCS#7 data\n";
LAB_0010df27:
    fprintf(_stderr,pcVar8,pname);
LAB_0010df31:
    ERR_print_errors_fp(_stderr);
  }
  else {
    iVar2 = OBJ_obj2nid(pPVar10->type);
    if (iVar2 == 0x16) {
      lVar16 = ((pPVar10->d).data)->flags;
      if (lVar16 != 0) {
        pPStack_1d28 = pPVar10;
        pBStack_1d20 = bp;
        iVar2 = OPENSSL_sk_num(lVar16);
        if (0 < iVar2) {
          uVar18 = 0;
          lStack_1d18 = lVar16;
          do {
            memset(acStack_1cd0,0,0x400);
            memset(acStack_18d0,0,0x400);
            pXVar11 = (X509 *)OPENSSL_sk_value(lVar16,uVar18);
            snprintf(acStack_18d0,0x400,"%s-%d",c_char,uVar18);
            pcVar8 = pname;
            if (v_flag != 0) {
              pXVar6 = X509_get_subject_name(pXVar11);
              pcVar7 = X509_NAME_oneline(pXVar6,acStack_1cd0,0x400);
              printf("\n%s: found certificate with\n  subject: %s\n",pcVar8,pcVar7);
            }
            if (v_flag != 0) {
              pXVar6 = X509_get_issuer_name(pXVar11);
              pcVar8 = X509_NAME_oneline(pXVar6,acStack_1cd0,0x400);
              printf("  issuer: %s\n",pcVar8);
            }
            iVar2 = X509_digest(pXVar11,(EVP_MD *)fp_alg,abStack_1d10,&uStack_1d2c);
            if (iVar2 == 0) goto LAB_0010df31;
            iVar2 = X509_get_ext_by_NID(pXVar11,0x57,-1);
            if (iVar2 < 0) {
              if (v_flag != 0) {
                puts("  basic constraints: (not included)");
              }
            }
            else {
              pXVar12 = X509_get_ext(pXVar11,iVar2);
              if (v_flag != 0) {
                printf("  basic constraints: ");
                X509V3_EXT_print_fp(_stdout,pXVar12,0,0);
                putchar(10);
              }
            }
            iVar2 = X509_get_ext_by_NID(pXVar11,0x53,-1);
            if (iVar2 < 0) {
              if (v_flag != 0) {
                puts("  usage: (not included)");
              }
            }
            else {
              pXVar12 = X509_get_ext(pXVar11,iVar2);
              if (v_flag != 0) {
                printf("  usage: ");
                X509V3_EXT_print_fp(_stdout,pXVar12,0,0);
                putchar(10);
              }
            }
            if (v_flag != 0) {
              iVar2 = EVP_MD_get_type(fp_alg);
              pcVar8 = OBJ_nid2sn(iVar2);
              printf("  %s fingerprint: ",pcVar8);
              uVar14 = (ulong)uStack_1d2c;
              if (0 < (int)uStack_1d2c) {
                uVar13 = 0;
                do {
                  uVar1 = uVar13 + 1;
                  uVar15 = 10;
                  if (uVar1 != (uVar14 & 0xffffffff)) {
                    uVar15 = 0x3a;
                  }
                  printf("%02X%c",(ulong)abStack_1d10[uVar13],uVar15);
                  uVar14 = (ulong)(int)uStack_1d2c;
                  uVar13 = uVar1;
                } while ((long)uVar1 < (long)uVar14);
              }
            }
            pFVar9 = fopen(acStack_18d0,"w");
            if (pFVar9 == (FILE *)0x0) {
              pcVar8 = "%s: cannot open cert file for writing\n";
              goto LAB_0010df71;
            }
            if (v_flag != 0) {
              printf("%s: certificate written as %s\n",pname,acStack_18d0);
            }
            if (d_flag != 0) {
              PEM_write_X509(_stdout,pXVar11);
            }
            iVar2 = PEM_write_X509(pFVar9,pXVar11);
            if (iVar2 != 1) {
              pcVar8 = "%s: error while writing certificate file\n";
              goto LAB_0010df27;
            }
            fclose(pFVar9);
            lVar16 = lStack_1d18;
            uVar3 = (int)uVar18 + 1;
            uVar18 = (ulong)uVar3;
            iVar2 = OPENSSL_sk_num(lStack_1d18);
          } while ((int)uVar3 < iVar2);
        }
        PKCS7_free(pPStack_1d28);
        BIO_free(pBStack_1d20);
        exit(0);
      }
      pcVar8 = "%s: cannot find certificates\n";
LAB_0010df71:
      fprintf(_stderr,pcVar8,pname);
    }
    else {
      printf("%s: wrong PKCS#7 type\n",pname);
    }
  }
  exit(0x5d);
}

Assistant:

void
write_crl(struct scep *s) {
	PKCS7			*p7;
	STACK_OF(X509_CRL)	*crls;
	X509_CRL		*crl;	
	FILE			*fp;

	/* Get CRL */
	p7 = s->reply_p7;
	crls = p7->d.sign->crl;
	
	/* We expect only one CRL: */
	crl = sk_X509_CRL_value(crls, 0);
	if (crl == NULL) {
		fprintf(stderr, "%s: cannot find CRL in reply\n", pname);
		exit (SCEP_PKISTATUS_FILE);
	}

	/* Write PEM-formatted file: */
#ifdef WIN32
	if ((fopen_s(&fp, w_char, "w")))
#else
	if (!(fp = fopen(w_char, "w")))
#endif
	{
		fprintf(stderr, "%s: cannot open CRL file for writing\n",
				pname);
		exit (SCEP_PKISTATUS_FILE);
	}
	if (v_flag)
		printf("%s: writing CRL\n", pname);
	if (d_flag)
		PEM_write_X509_CRL(stdout, crl);
	if (PEM_write_X509_CRL(fp, crl) != 1) {
		fprintf(stderr, "%s: error while writing CRL "
			"file\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_FILE);
	}
	printf("%s: CRL written as %s\n", pname, w_char);
	(void)fclose(fp);
}